

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteNull(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this)

{
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  Ch in_stack_ffffffffffffffef;
  
  PutReserve<rapidjson::UTF8<char>,rapidjson::CrtAllocator>
            (in_RDI,CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(in_RDI,in_stack_ffffffffffffffef);
  PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(in_RDI,in_stack_ffffffffffffffef);
  PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(in_RDI,in_stack_ffffffffffffffef);
  PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(in_RDI,in_stack_ffffffffffffffef);
  return true;
}

Assistant:

bool WriteNull()  {
        PutReserve(*os_, 4);
        PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 'l'); return true;
    }